

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O1

char * __thiscall crypto::xchacha20::crypt(xchacha20 *this,char *__key,char *__salt)

{
  byte bVar1;
  uint uVar2;
  char *in_RAX;
  long in_RCX;
  long lVar3;
  
  if (in_RCX != 0) {
    lVar3 = 0;
    do {
      if (this->pos == '@') {
        update(this);
        this->pos = '\0';
      }
      uVar2 = *(uint *)((long)this->keystream + (ulong)(this->pos & 0xfffffffc)) >>
              ((this->pos & 3) << 3);
      bVar1 = (byte)uVar2 ^ __key[lVar3];
      in_RAX = (char *)(ulong)CONCAT31((int3)(uVar2 >> 8),bVar1);
      __salt[lVar3] = bVar1;
      lVar3 = lVar3 + 1;
      this->pos = this->pos + '\x01';
    } while (in_RCX != lVar3);
  }
  return in_RAX;
}

Assistant:

void xchacha20::crypt(const char * in, char * out, size_t length) {
	
	// asume pos > 0 && pos <= 64
	
	for(size_t i = 0; i < length; i++, pos++) {
		if(pos == sizeof(keystream)) {
			update();
			pos = 0;
		}
		boost::uint8_t key = boost::uint8_t(keystream[pos / sizeof(word)] >> ((pos % sizeof(word)) * 8));
		out[i] = char(boost::uint8_t(in[i]) ^ key);
	}
	
}